

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

void xmlSerializeText(xmlOutputBufferPtr buf,xmlChar *string,uint flags)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  byte *utf;
  byte bVar5;
  int len;
  char tempBuf [12];
  int local_40;
  char local_3c [12];
  
  if (string != (xmlChar *)0x0) {
    pcVar3 = "";
    if ((flags & 1) == 0) {
      pcVar3 = "";
    }
    bVar5 = *string;
    if (bVar5 != 0) {
LAB_0016ef64:
      uVar4 = 0xffffffff;
      iVar1 = 0;
      utf = string;
      do {
        if ((char)bVar5 < '\0') {
          if ((flags & 2) != 0) goto LAB_0016ef95;
        }
        else {
          uVar4 = (uint)pcVar3[bVar5];
          if (-1 < pcVar3[bVar5]) goto LAB_0016ef95;
        }
        bVar5 = utf[1];
        utf = utf + 1;
        iVar1 = iVar1 + 1;
      } while( true );
    }
  }
  return;
LAB_0016ef95:
  if (string < utf) {
    xmlOutputBufferWrite(buf,iVar1,(char *)string);
  }
  if (-1 < (int)uVar4) {
    if (bVar5 == 0) {
      return;
    }
    xmlOutputBufferWrite
              (buf,(int)"\b&#xFFFD;\x04&#9;\x05&#10;\x05&#13;\x06&quot;\x05&amp;\x04&lt;\x04&gt;"
                        [uVar4],
               "\b&#xFFFD;\x04&#9;\x05&#10;\x05&#13;\x06&quot;\x05&amp;\x04&lt;\x04&gt;" +
               (ulong)uVar4 + 1);
    string = utf + 1;
    goto LAB_0016f073;
  }
  local_40 = 4;
  uVar4 = xmlGetUTF8Char(utf,&local_40);
  if ((int)uVar4 < 0) {
    uVar4 = 0xfffd;
    lVar2 = 1;
  }
  else {
    if (uVar4 < 0x100) {
      if (uVar4 < 0x20) {
        if (4 < uVar4 - 9) goto LAB_0016f04a;
        uVar4 = *(uint *)(&DAT_001d8824 + (ulong)(uVar4 - 9) * 4);
      }
    }
    else if (0xfffff < uVar4 - 0x10000 && (0x1ffd < uVar4 - 0xe000 && 0xd7ff < uVar4)) {
LAB_0016f04a:
      uVar4 = 0xfffd;
    }
    lVar2 = (long)local_40;
  }
  string = utf + lVar2;
  iVar1 = xmlSerializeHexCharRef(local_3c,uVar4);
  xmlOutputBufferWrite(buf,iVar1,local_3c);
LAB_0016f073:
  bVar5 = *string;
  if (bVar5 == 0) {
    return;
  }
  goto LAB_0016ef64;
}

Assistant:

static void
xmlSerializeText(xmlOutputBufferPtr buf, const xmlChar *string,
                 unsigned flags) {
    const char *cur;
    const signed char *tab;

    if (string == NULL)
        return;

    if (flags & XML_ESCAPE_ATTR)
        tab = xmlEscapeTabAttr;
    else
        tab = xmlEscapeTab;

    cur = (const char *) string;

    while (*cur != 0) {
        const char *base;
        int c;
        int offset;

        base = cur;
        offset = -1;

        while (1) {
            c = (unsigned char) *cur;

            if (c < 0x80) {
                offset = tab[c];
                if (offset >= 0)
                    break;
            } else if (flags & XML_ESCAPE_NON_ASCII) {
                break;
            }

            cur += 1;
        }

        if (cur > base)
            xmlOutputBufferWrite(buf, cur - base, base);

        if (offset >= 0) {
            if (c == 0)
                break;

            xmlOutputBufferWrite(buf, xmlEscapeContent[offset],
                                 &xmlEscapeContent[offset+1]);
            cur += 1;
        } else {
            char tempBuf[12];
            int tempSize;
            int val = 0, len = 4;

            val = xmlGetUTF8Char((const xmlChar *) cur, &len);
            if (val < 0) {
                val = 0xFFFD;
                cur += 1;
            } else {
                if (!IS_CHAR(val))
                    val = 0xFFFD;
                cur += len;
            }

            tempSize = xmlSerializeHexCharRef(tempBuf, val);
            xmlOutputBufferWrite(buf, tempSize, tempBuf);
        }
    }
}